

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O2

void mcode_protfail(jit_State *J)

{
  BPropEntry BVar1;
  lua_State *L;
  TValue *pTVar2;
  GCstr *pGVar3;
  
  BVar1 = J[-1].bpropcache[9];
  if (BVar1 != (BPropEntry)0x0) {
    L = J->L;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pGVar3 = lj_err_str(L,LJ_ERR_JITPROT);
    (pTVar2->u32).lo = (uint32_t)pGVar3;
    (pTVar2->field_2).it = 0xfffffffb;
    (*(code *)BVar1)(L);
  }
  exit(1);
}

Assistant:

void mcode_protfail(jit_State *J)
{
  lua_CFunction panic = J2G(J)->panic;
  if (panic) {
    lua_State *L = J->L;
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITPROT));
    panic(L);
  }
  exit(EXIT_FAILURE);
}